

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlevdur.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  istream *input_stream_00;
  long in_RSI;
  int in_EDI;
  bool bVar5;
  ostringstream error_message_6;
  ostringstream error_message_5;
  vector<double,_std::allocator<double>_> linear_predictive_coefficients;
  vector<double,_std::allocator<double>_> autocorrelation;
  int length;
  ostringstream error_message_4;
  Buffer buffer;
  ReverseLevinsonDurbinRecursion reverse_levinson_durbin_recursion;
  istream *input_stream;
  ostringstream error_message_3;
  ifstream ifs;
  ostringstream error_message_2;
  char *input_file;
  ostringstream error_message_1;
  int num_input_files;
  ostringstream error_message;
  int option_char;
  int num_order;
  option *in_stack_fffffffffffff098;
  Buffer *in_stack_fffffffffffff0a0;
  string *in_stack_fffffffffffff0a8;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffff0b0;
  int in_stack_fffffffffffff0b4;
  size_type in_stack_fffffffffffff0b8;
  undefined6 in_stack_fffffffffffff0c0;
  undefined1 in_stack_fffffffffffff0c6;
  undefined1 in_stack_fffffffffffff0c7;
  int *actual_write_size;
  vector<double,_std::allocator<double>_> *sequence_to_read;
  undefined8 in_stack_fffffffffffff0e8;
  int in_stack_fffffffffffff0f0;
  undefined1 in_stack_fffffffffffff0f6;
  char *local_f08;
  undefined7 in_stack_fffffffffffff100;
  char *local_ec0;
  allocator local_e71;
  string local_e70 [32];
  ostringstream local_e50 [96];
  Buffer *in_stack_fffffffffffff210;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff218;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff220;
  ReverseLevinsonDurbinRecursion *in_stack_fffffffffffff228;
  ostringstream *in_stack_fffffffffffff288;
  string *in_stack_fffffffffffff290;
  allocator local_cd1;
  string local_cd0 [32];
  ostringstream local_cb0 [383];
  int local_b31 [8];
  vector<double,_std::allocator<double>_> local_b11;
  int local_af8;
  allocator local_af1;
  string local_af0 [32];
  ostringstream local_ad0 [472];
  ReverseLevinsonDurbinRecursion local_8f8;
  char *local_8e8;
  undefined4 local_8e0;
  allocator local_8d9;
  string local_8d8 [32];
  ostringstream local_8b8 [376];
  char local_740 [527];
  allocator local_531;
  string local_530 [32];
  ostringstream local_510 [376];
  char *local_398;
  allocator local_389;
  string local_388 [32];
  ostringstream local_368 [376];
  int local_1f0;
  allocator local_1e9;
  string local_1e8 [32];
  ostringstream local_1c8 [399];
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_18 = ya_getopt_long(in_stack_fffffffffffff0b4,(char **)in_stack_fffffffffffff0a8,
                                   (char *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,
                                   (int *)0x1036ff), pcVar1 = ya_optarg, local_18 != -1) {
    if (local_18 == 0x68) {
      anon_unknown.dwarf_18c0::PrintUsage((ostream *)in_stack_fffffffffffff0a0);
      return 0;
    }
    if (local_18 != 0x6d) {
      anon_unknown.dwarf_18c0::PrintUsage((ostream *)in_stack_fffffffffffff0a0);
      return 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    bVar2 = sptk::ConvertStringToInteger(in_stack_fffffffffffff0a8,(int *)in_stack_fffffffffffff0a0)
    ;
    bVar5 = local_14 < 0;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (!bVar2 || bVar5) {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar4 = std::operator<<((ostream *)local_1c8,"The argument for the -m option must be a ");
      std::operator<<(poVar4,"non-negative integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"rlevdur",&local_1e9);
      sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
      return local_4;
    }
  }
  local_1f0 = local_8 - ya_optind;
  if (1 < local_1f0) {
    std::__cxx11::ostringstream::ostringstream(local_368);
    std::operator<<((ostream *)local_368,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_388,"rlevdur",&local_389);
    sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_368);
    return local_4;
  }
  if (local_1f0 == 0) {
    local_ec0 = (char *)0x0;
  }
  else {
    local_ec0 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_398 = local_ec0;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_510);
    std::operator<<((ostream *)local_510,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_530,"rlevdur",&local_531);
    sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
    std::__cxx11::string::~string(local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_510);
    return local_4;
  }
  std::ifstream::ifstream(local_740);
  pcVar1 = local_398;
  if (local_398 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_740,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_8b8);
      poVar4 = std::operator<<((ostream *)local_8b8,"Cannot open file ");
      std::operator<<(poVar4,local_398);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8d8,"rlevdur",&local_8d9);
      sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
      std::__cxx11::string::~string(local_8d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
      local_4 = 1;
      local_8e0 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_8b8);
      goto LAB_00104489;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_f08 = (char *)&std::cin;
  }
  else {
    local_f08 = local_740;
  }
  local_8e8 = local_f08;
  sptk::ReverseLevinsonDurbinRecursion::ReverseLevinsonDurbinRecursion(&local_8f8,local_14);
  sptk::ReverseLevinsonDurbinRecursion::Buffer::Buffer(in_stack_fffffffffffff0a0);
  bVar2 = sptk::ReverseLevinsonDurbinRecursion::IsValid(&local_8f8);
  if (bVar2) {
    local_af8 = local_14 + 1;
    input_stream_00 = (istream *)(long)local_af8;
    sequence_to_read = &local_b11;
    std::allocator<double>::allocator((allocator<double> *)0x104057);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffff0c7,
                        CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
               in_stack_fffffffffffff0b8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0));
    std::allocator<double>::~allocator((allocator<double> *)0x10407d);
    actual_write_size = local_b31;
    std::allocator<double>::allocator((allocator<double> *)0x10409c);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffff0c7,
                        CONCAT16(in_stack_fffffffffffff0c6,in_stack_fffffffffffff0c0)),
               in_stack_fffffffffffff0b8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0));
    std::allocator<double>::~allocator((allocator<double> *)0x1040c2);
    do {
      bVar2 = sptk::ReadStream<double>
                        ((bool)in_stack_fffffffffffff0f6,in_stack_fffffffffffff0f0,
                         (int)((ulong)in_stack_fffffffffffff0e8 >> 0x20),
                         (int)in_stack_fffffffffffff0e8,sequence_to_read,input_stream_00,
                         (int *)CONCAT17(bVar3,in_stack_fffffffffffff100));
      if (!bVar2) {
        local_4 = 0;
        local_8e0 = 1;
        goto LAB_00104419;
      }
      bVar2 = sptk::ReverseLevinsonDurbinRecursion::Run
                        (in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                         in_stack_fffffffffffff218,in_stack_fffffffffffff210);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_cb0);
        std::operator<<((ostream *)local_cb0,"Failed to solve autocorrelation normal equations");
        paVar6 = &local_cd1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_cd0,"rlevdur",paVar6);
        sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
        std::__cxx11::string::~string(local_cd0);
        std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
        local_4 = 1;
        local_8e0 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_cb0);
        goto LAB_00104419;
      }
      bVar2 = sptk::WriteStream<double>
                        (in_stack_fffffffffffff0f0,(int)((ulong)in_stack_fffffffffffff0e8 >> 0x20),
                         sequence_to_read,(ostream *)input_stream_00,actual_write_size);
      in_stack_fffffffffffff0b4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff0b4);
    } while (bVar2);
    std::__cxx11::ostringstream::ostringstream(local_e50);
    std::operator<<((ostream *)local_e50,"Failed to write autocorrelation");
    paVar6 = &local_e71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e70,"rlevdur",paVar6);
    sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
    std::__cxx11::string::~string(local_e70);
    std::allocator<char>::~allocator((allocator<char> *)&local_e71);
    local_4 = 1;
    local_8e0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e50);
LAB_00104419:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_ad0);
    std::operator<<((ostream *)local_ad0,"Failed to initialize ReverseLevinsonDurbinRecursion");
    paVar6 = &local_af1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_af0,"rlevdur",paVar6);
    sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
    std::__cxx11::string::~string(local_af0);
    std::allocator<char>::~allocator((allocator<char> *)&local_af1);
    local_4 = 1;
    local_8e0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_ad0);
  }
  sptk::ReverseLevinsonDurbinRecursion::Buffer::~Buffer(in_stack_fffffffffffff0a0);
  sptk::ReverseLevinsonDurbinRecursion::~ReverseLevinsonDurbinRecursion(&local_8f8);
LAB_00104489:
  std::ifstream::~ifstream(local_740);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("rlevdur", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("rlevdur", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("rlevdur", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("rlevdur", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::ReverseLevinsonDurbinRecursion reverse_levinson_durbin_recursion(
      num_order);
  sptk::ReverseLevinsonDurbinRecursion::Buffer buffer;
  if (!reverse_levinson_durbin_recursion.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize ReverseLevinsonDurbinRecursion";
    sptk::PrintErrorMessage("rlevdur", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> autocorrelation(length);
  std::vector<double> linear_predictive_coefficients(length);

  while (sptk::ReadStream(false, 0, 0, length, &linear_predictive_coefficients,
                          &input_stream, NULL)) {
    if (!reverse_levinson_durbin_recursion.Run(linear_predictive_coefficients,
                                               &autocorrelation, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to solve autocorrelation normal equations";
      sptk::PrintErrorMessage("rlevdur", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, autocorrelation, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write autocorrelation";
      sptk::PrintErrorMessage("rlevdur", error_message);
      return 1;
    }
  }

  return 0;
}